

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void close_func(LexState *ls)

{
  lua_State *plVar1;
  FuncState *pFVar2;
  Proto *pPVar3;
  lua_State *L_00;
  LocVar *block;
  LexState *ls_00;
  LexState *in_RDI;
  Proto *f;
  FuncState *fs;
  lua_State *L;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  FuncState *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  TValue *local_38;
  int *local_30;
  Instruction *local_28;
  
  plVar1 = in_RDI->L;
  pFVar2 = in_RDI->fs;
  pPVar3 = pFVar2->f;
  removevars(in_RDI,0);
  luaK_ret(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if ((ulong)(long)(pFVar2->pc + 1) < 0x4000000000000000) {
    local_28 = (Instruction *)
               luaM_realloc_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             (size_t)in_stack_ffffffffffffffb0,
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    local_28 = (Instruction *)luaM_toobig((lua_State *)0x1124b6);
  }
  pPVar3->code = local_28;
  pPVar3->sizecode = pFVar2->pc;
  if ((ulong)(long)(pFVar2->pc + 1) < 0x4000000000000000) {
    local_30 = (int *)luaM_realloc_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                    (size_t)in_stack_ffffffffffffffb0,
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    local_30 = (int *)luaM_toobig((lua_State *)0x112533);
  }
  pPVar3->lineinfo = local_30;
  pPVar3->sizelineinfo = pFVar2->pc;
  if ((ulong)(long)(pFVar2->nk + 1) < 0x1000000000000000) {
    local_38 = (TValue *)
               luaM_realloc_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             (size_t)in_stack_ffffffffffffffb0,
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    local_38 = (TValue *)luaM_toobig((lua_State *)0x1125b0);
  }
  pPVar3->k = local_38;
  pPVar3->sizek = pFVar2->nk;
  if ((ulong)(long)(pFVar2->np + 1) < 0x2000000000000000) {
    L_00 = (lua_State *)
           luaM_realloc_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (size_t)in_stack_ffffffffffffffb0,
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    L_00 = (lua_State *)luaM_toobig((lua_State *)0x11262d);
  }
  pPVar3->p = (Proto **)L_00;
  pPVar3->sizep = pFVar2->np;
  if ((ulong)(long)(pFVar2->nlocvars + 1) < 0x1000000000000000) {
    block = (LocVar *)
            luaM_realloc_(L_00,in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    block = (LocVar *)luaM_toobig((lua_State *)0x1126ac);
  }
  pPVar3->locvars = block;
  pPVar3->sizelocvars = (int)pFVar2->nlocvars;
  if ((ulong)(long)(int)(pPVar3->nups + 1) < 0x2000000000000000) {
    ls_00 = (LexState *)
            luaM_realloc_(L_00,block,(size_t)in_stack_ffffffffffffffb0,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    ls_00 = (LexState *)luaM_toobig((lua_State *)0x11272d);
  }
  pPVar3->upvalues = (TString **)ls_00;
  pPVar3->sizeupvalues = (uint)pPVar3->nups;
  in_RDI->fs = pFVar2->prev;
  if (pFVar2 != (FuncState *)0x0) {
    anchor_token(ls_00);
  }
  plVar1->top = plVar1->top + -2;
  return;
}

Assistant:

static void close_func(LexState*ls){
lua_State*L=ls->L;
FuncState*fs=ls->fs;
Proto*f=fs->f;
removevars(ls,0);
luaK_ret(fs,0,0);
luaM_reallocvector(L,f->code,f->sizecode,fs->pc,Instruction);
f->sizecode=fs->pc;
luaM_reallocvector(L,f->lineinfo,f->sizelineinfo,fs->pc,int);
f->sizelineinfo=fs->pc;
luaM_reallocvector(L,f->k,f->sizek,fs->nk,TValue);
f->sizek=fs->nk;
luaM_reallocvector(L,f->p,f->sizep,fs->np,Proto*);
f->sizep=fs->np;
luaM_reallocvector(L,f->locvars,f->sizelocvars,fs->nlocvars,LocVar);
f->sizelocvars=fs->nlocvars;
luaM_reallocvector(L,f->upvalues,f->sizeupvalues,f->nups,TString*);
f->sizeupvalues=f->nups;
ls->fs=fs->prev;
if(fs)anchor_token(ls);
L->top-=2;
}